

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

void __thiscall perfetto::protos::pbzero::EventCategory::set_iid(EventCategory *this,uint64_t value)

{
  protozero::Message::AppendVarInt<unsigned_long>(&this->super_Message,1,value);
  return;
}

Assistant:

void set_iid(uint64_t value) {
    static constexpr uint32_t field_id = FieldMetadata_Iid::kFieldId;
    // Call the appropriate protozero::Message::Append(field_id, ...)
    // method based on the type of the field.
    ::protozero::internal::FieldWriter<
      ::protozero::proto_utils::ProtoSchemaType::kUint64>
        ::Append(*this, field_id, value);
  }